

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::InlinedVector(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *this,InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *other)

{
  undefined8 *in_RSI;
  polymorphic_allocator<pbrt::ParsedParameter*> *in_RDI;
  int i;
  int local_14;
  
  *(undefined8 *)in_RDI = *in_RSI;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x58) = in_RSI[0xb];
  *(undefined8 *)(in_RDI + 0x50) = in_RSI[10];
  *(undefined8 *)(in_RDI + 8) = in_RSI[1];
  if ((ulong)in_RSI[0xb] < 9) {
    for (local_14 = 0; (ulong)(long)local_14 < (ulong)in_RSI[0xb]; local_14 = local_14 + 1) {
      pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
      construct<pbrt::ParsedParameter*,pbrt::ParsedParameter*>
                (in_RDI,(ParsedParameter **)(in_RDI + (long)local_14 * 8 + 0x10),
                 (ParsedParameter **)(in_RSI + (long)local_14 + 2));
    }
  }
  else {
    in_RSI[0xb] = 0;
  }
  in_RSI[10] = 0;
  in_RSI[1] = 0;
  return;
}

Assistant:

InlinedVector(InlinedVector &&other) : alloc(other.alloc) {
        nStored = other.nStored;
        nAlloc = other.nAlloc;
        ptr = other.ptr;
        if (other.nStored <= N)
            for (int i = 0; i < other.nStored; ++i)
                alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
        // Leave other.nStored as is, so that the detrius left after we
        // moved out of fixed has its destructors run...
        else
            other.nStored = 0;

        other.nAlloc = 0;
        other.ptr = nullptr;
    }